

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_concat(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  int iVar1;
  lyxp_set *plVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  char *pcVar5;
  size_t sVar6;
  lyxp_set_node *__ptr;
  uint uVar7;
  char *format;
  long lVar8;
  undefined4 uVar9;
  ly_ctx *ctx;
  ushort *puVar10;
  ulong uVar11;
  
  if ((options & 0x1c) == 0) {
    if (arg_count == 0) {
      __ptr = (lyxp_set_node *)0x0;
    }
    else {
      lVar8 = 1;
      uVar11 = 0;
      __ptr = (lyxp_set_node *)0x0;
      do {
        LVar4 = lyxp_set_cast(args[uVar11],LYXP_SET_STRING);
        if (LVar4 != LY_SUCCESS) {
          free(__ptr);
          return LVar4;
        }
        sVar6 = strlen((args[uVar11]->val).str);
        __ptr = (lyxp_set_node *)ly_realloc(__ptr,sVar6 + lVar8);
        if (__ptr == (lyxp_set_node *)0x0) {
          ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_concat");
          return LY_EMEM;
        }
        strcpy((char *)((long)__ptr + lVar8 + -1),(args[uVar11]->val).str);
        sVar6 = strlen((args[uVar11]->val).str);
        lVar8 = lVar8 + sVar6;
        uVar11 = uVar11 + 1;
      } while (arg_count != uVar11);
    }
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    (set->val).nodes = __ptr;
  }
  else {
    if (arg_count != 0) {
      uVar11 = 0;
      do {
        plVar2 = args[uVar11];
        if (plVar2->type == LYXP_SET_SCNODE_SET) {
          uVar7 = plVar2->used;
          do {
            uVar7 = uVar7 - 1;
            if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar7 * 0x18 + 0xc) == 2) {
              puVar10 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar7 * 0x18);
              goto LAB_001b5781;
            }
          } while (uVar7 != 0);
          puVar10 = (ushort *)0x0;
LAB_001b5781:
          if (puVar10 != (ushort *)0x0) {
            if ((*puVar10 & 0xc) == 0) {
              ctx = set->ctx;
              pcVar5 = lys_nodetype2str(*puVar10);
              format = "Argument #%u of %s is a %s node \"%s\".";
            }
            else {
              lVar3 = warn_is_string_type(*(lysc_type **)(puVar10 + 0x30));
              if (lVar3 != '\0') goto LAB_001b5804;
              ctx = set->ctx;
              format = "Argument #%u of %s is node \"%s\", not of string-type.";
              pcVar5 = *(char **)(puVar10 + 0x14);
            }
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,(ulong)((int)uVar11 + 1),"xpath_concat",pcVar5);
          }
        }
LAB_001b5804:
        uVar11 = uVar11 + 1;
      } while (uVar11 != arg_count);
    }
    uVar7 = set->used;
    if ((ulong)uVar7 != 0) {
      lVar8 = 0;
      do {
        iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar8);
        if (iVar1 == 2) {
          uVar9 = 1;
LAB_001b5844:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar8) = uVar9;
        }
        else if (iVar1 == -2) {
          uVar9 = 0xffffffff;
          goto LAB_001b5844;
        }
        lVar8 = lVar8 + 0x18;
      } while ((ulong)uVar7 * 0x18 != lVar8);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_concat(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i;
    char *str = NULL;
    size_t used = 1;
    LY_ERR rc = LY_SUCCESS;
    struct lysc_node_leaf *sleaf;

    if (options & LYXP_SCNODE_ALL) {
        for (i = 0; i < arg_count; ++i) {
            if ((args[i]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[i]))) {
                if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                    LOGWRN(set->ctx, "Argument #%" PRIu32 " of %s is a %s node \"%s\".",
                            i + 1, __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
                } else if (!warn_is_string_type(sleaf->type)) {
                    LOGWRN(set->ctx, "Argument #%" PRIu32 " of %s is node \"%s\", not of string-type.", i + 1, __func__,
                            sleaf->name);
                }
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    for (i = 0; i < arg_count; ++i) {
        rc = lyxp_set_cast(args[i], LYXP_SET_STRING);
        if (rc != LY_SUCCESS) {
            free(str);
            return rc;
        }

        str = ly_realloc(str, (used + strlen(args[i]->val.str)) * sizeof(char));
        LY_CHECK_ERR_RET(!str, LOGMEM(set->ctx), LY_EMEM);
        strcpy(str + used - 1, args[i]->val.str);
        used += strlen(args[i]->val.str);
    }

    /* free, kind of */
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    set->val.str = str;

    return LY_SUCCESS;
}